

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O0

int Saig_ManExtendOneEval(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_2c;
  int Value;
  int Value1;
  int Value0;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Vec_Ptr_t *vSimInfo_local;
  
  pAVar2 = Aig_ObjFanin0(pObj);
  Value = Saig_ManSimInfoGet(vSimInfo,pAVar2,iFrame);
  iVar1 = Aig_ObjFaninC0(pObj);
  if (iVar1 != 0) {
    Value = Saig_ManSimInfoNot(Value);
  }
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                    ,0x9a,"int Saig_ManExtendOneEval(Vec_Ptr_t *, Aig_Obj_t *, int)");
    }
    pAVar2 = Aig_ObjFanin1(pObj);
    local_2c = Saig_ManSimInfoGet(vSimInfo,pAVar2,iFrame);
    iVar1 = Aig_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_2c = Saig_ManSimInfoNot(local_2c);
    }
    vSimInfo_local._4_4_ = Saig_ManSimInfoAnd(Value,local_2c);
    Saig_ManSimInfoSet(vSimInfo,pObj,iFrame,vSimInfo_local._4_4_);
  }
  else {
    Saig_ManSimInfoSet(vSimInfo,pObj,iFrame,Value);
    vSimInfo_local._4_4_ = Value;
  }
  return vSimInfo_local._4_4_;
}

Assistant:

int Saig_ManExtendOneEval( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value0 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Saig_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    Value1 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin1(pObj), iFrame );
    if ( Aig_ObjFaninC1(pObj) )
        Value1 = Saig_ManSimInfoNot( Value1 );
    Value = Saig_ManSimInfoAnd( Value0, Value1 );
    Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    return Value;
}